

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

RSAPrimeDetails *
setup_rsa_prime(RSAPrimeDetails *__return_storage_ptr__,int bits,_Bool strong,
               PrimeGenerationContext *pgc,ProgressReceiver *prog)

{
  uint uVar1;
  uint uVar2;
  ProgressPhase PVar3;
  undefined7 in_register_00000011;
  uint uVar4;
  
  __return_storage_ptr__->bits = bits;
  if ((int)CONCAT71(in_register_00000011,strong) == 0) {
    __return_storage_ptr__->strong = false;
  }
  else {
    uVar1 = (bits + -0x21) / 2;
    __return_storage_ptr__->bitsm1 = uVar1;
    uVar4 = (bits + -0x21) - uVar1;
    __return_storage_ptr__->bitsp1 = uVar4;
    uVar2 = (int)(uVar1 - 0x21) / 2;
    __return_storage_ptr__->bitsm1m1 = uVar2;
    __return_storage_ptr__->strong = 0xe6 < bits;
    if (0xe6 < bits) {
      PVar3 = (*pgc->vt->add_progress_phase)(pgc->vt,prog,uVar2);
      (__return_storage_ptr__->phase_m1m1).p = (void *)PVar3;
      PVar3 = (*pgc->vt->add_progress_phase)(pgc->vt,prog,uVar1);
      (__return_storage_ptr__->phase_m1).p = (void *)PVar3;
      PVar3 = (*pgc->vt->add_progress_phase)(pgc->vt,prog,uVar4);
      (__return_storage_ptr__->phase_p1).p = (void *)PVar3;
    }
  }
  PVar3 = (*pgc->vt->add_progress_phase)(pgc->vt,prog,bits);
  (__return_storage_ptr__->phase_main).p = (void *)PVar3;
  return __return_storage_ptr__;
}

Assistant:

static RSAPrimeDetails setup_rsa_prime(
    int bits, bool strong, PrimeGenerationContext *pgc, ProgressReceiver *prog)
{
    RSAPrimeDetails pd;
    pd.bits = bits;
    if (strong) {
        pd.bitsm1 = (bits - STRONG_MARGIN) / 2;
        pd.bitsp1 = (bits - STRONG_MARGIN) - pd.bitsm1;
        pd.bitsm1m1 = (pd.bitsm1 - STRONG_MARGIN) / 2;
        if (pd.bitsm1m1 < STRONG_MARGIN) {
            /* Absurdly small prime, but we should at least not crash. */
            strong = false;
        }
    }
    pd.strong = strong;

    if (pd.strong) {
        pd.phase_m1m1 = primegen_add_progress_phase(pgc, prog, pd.bitsm1m1);
        pd.phase_m1 = primegen_add_progress_phase(pgc, prog, pd.bitsm1);
        pd.phase_p1 = primegen_add_progress_phase(pgc, prog, pd.bitsp1);
    }
    pd.phase_main = primegen_add_progress_phase(pgc, prog, pd.bits);

    return pd;
}